

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O0

void cpp_wrapper_get(planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,int expected_value,
                    ion_err_t expected_status,ion_result_count_t expected_count)

{
  ion_status_t iVar1;
  planck_unit_result_t pVar2;
  int actual;
  char local_34;
  int32_t iStack_30;
  ion_status_t status;
  int retval;
  ion_result_count_t expected_count_local;
  ion_err_t expected_status_local;
  int expected_value_local;
  int key_local;
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  actual = Dictionary<int,_int>::get(dict,key);
  iVar1 = dict->last_status;
  local_34 = iVar1.error;
  pVar2 = planck_unit_assert_int_are_equal
                    (tc,(int)expected_status,(int)local_34,0xe0,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  iStack_30 = iVar1.count;
  pVar2 = planck_unit_assert_int_are_equal
                    (tc,expected_count,iStack_30,0xe1,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar2 != '\0') {
    if ((local_34 == '\0') &&
       (pVar2 = planck_unit_assert_int_are_equal
                          (tc,expected_value,actual,0xe4,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                          ), pVar2 == '\0')) {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    return;
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_get(
	planck_unit_test_t *tc,
	Dictionary<int, int>	*dict,
	int key,
	int expected_value,
	ion_err_t expected_status,
	ion_result_count_t expected_count
) {
	int				retval	= dict->get(key);
	ion_status_t	status	= dict->last_status;

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (err_ok == status.error) {
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_value, retval);
	}
}